

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O0

void __thiscall
Assimp::ComputeUVMappingProcess::ComputeCylinderMapping
          (ComputeUVMappingProcess *this,aiMesh *mesh,aiVector3D *axis,aiVector3D *out)

{
  aiVector3D *paVar1;
  float fVar2;
  double dVar3;
  aiVector3t<float> aVar4;
  aiVector3D *uv_3;
  float local_f8;
  float local_ec;
  float fStack_e8;
  aiVector3D pos_3;
  uint pnt_3;
  ai_real diff_3;
  aiMatrix4x4 mTrafo;
  aiVector3D *uv_2;
  aiVector3D *pos_2;
  uint pnt_2;
  ai_real diff_2;
  aiVector3D *uv_1;
  aiVector3D *pos_1;
  uint pnt_1;
  ai_real diff_1;
  aiVector3D *uv;
  aiVector3D *pos;
  uint pnt;
  ai_real diff;
  aiVector3D max;
  aiVector3D min;
  aiVector3D center;
  aiVector3D *out_local;
  aiVector3D *axis_local;
  aiMesh *mesh_local;
  ComputeUVMappingProcess *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&min.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&max.y);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&pnt);
  fVar2 = ::operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_x);
  if (fVar2 < 0.95) {
    fVar2 = ::operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y);
    if (fVar2 < 0.95) {
      fVar2 = ::operator*(axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_z);
      if (fVar2 < 0.95) {
        aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&pnt_3);
        aiMatrix4x4t<float>::FromToMatrix
                  (axis,(aiVector3t<float> *)(anonymous_namespace)::base_axis_y,
                   (aiMatrix4x4t<float> *)&pnt_3);
        FindMeshCenterTransformed
                  (mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)&pnt,
                   (aiMatrix4x4 *)&pnt_3);
        fVar2 = diff - max.z;
        for (pos_3.y = 0.0; (uint)pos_3.y < mesh->mNumVertices; pos_3.y = (float)((int)pos_3.y + 1))
        {
          aVar4 = ::operator*((aiMatrix4x4t<float> *)&pnt_3,mesh->mVertices + (uint)pos_3.y);
          local_f8 = aVar4.z;
          fStack_e8 = aVar4.y;
          out[(uint)pos_3.y].y = (fStack_e8 - max.z) / fVar2;
          local_ec = aVar4.x;
          dVar3 = std::atan2((double)(ulong)(uint)(local_ec - min.y),
                             (double)(ulong)(uint)(local_f8 - center.x));
          out[(uint)pos_3.y].x = (SUB84(dVar3,0) + 3.1415927) / 6.2831855;
        }
      }
      else {
        FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)&pnt);
        fVar2 = max.x - min.x;
        for (pos_2._0_4_ = 0; (uint)pos_2 < mesh->mNumVertices; pos_2._0_4_ = (uint)pos_2 + 1) {
          paVar1 = mesh->mVertices + (uint)pos_2;
          mTrafo._56_8_ = out + (uint)pos_2;
          ((aiVector3D *)mTrafo._56_8_)->y = (paVar1->z - min.x) / fVar2;
          dVar3 = std::atan2((double)(ulong)(uint)(paVar1->y - min.z),
                             (double)(ulong)(uint)(paVar1->x - min.y));
          *(float *)mTrafo._56_8_ = (SUB84(dVar3,0) + 3.1415927) / 6.2831855;
        }
      }
    }
    else {
      FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)&pnt);
      fVar2 = diff - max.z;
      for (pos_1._0_4_ = 0; (uint)pos_1 < mesh->mNumVertices; pos_1._0_4_ = (uint)pos_1 + 1) {
        paVar1 = mesh->mVertices + (uint)pos_1;
        out[(uint)pos_1].y = (paVar1->y - max.z) / fVar2;
        dVar3 = std::atan2((double)(ulong)(uint)(paVar1->x - min.y),
                           (double)(ulong)(uint)(paVar1->z - center.x));
        out[(uint)pos_1].x = (SUB84(dVar3,0) + 3.1415927) / 6.2831855;
      }
    }
  }
  else {
    FindMeshCenter(mesh,(aiVector3D *)&min.y,(aiVector3D *)&max.y,(aiVector3D *)&pnt);
    fVar2 = (float)pnt - max.y;
    for (pos._4_4_ = 0; pos._4_4_ < mesh->mNumVertices; pos._4_4_ = pos._4_4_ + 1) {
      paVar1 = mesh->mVertices + pos._4_4_;
      out[pos._4_4_].y = (paVar1->x - max.y) / fVar2;
      dVar3 = std::atan2((double)(ulong)(uint)(paVar1->z - center.x),
                         (double)(ulong)(uint)(paVar1->y - min.z));
      out[pos._4_4_].x = (SUB84(dVar3,0) + 3.1415927) / 6.2831855;
    }
  }
  RemoveUVSeams(mesh,out);
  return;
}

Assistant:

void ComputeUVMappingProcess::ComputeCylinderMapping(aiMesh* mesh,const aiVector3D& axis, aiVector3D* out)
{
    aiVector3D center, min, max;

    // If the axis is one of x,y,z run a faster code path. It's worth the extra effort ...
    // currently the mapping axis will always be one of x,y,z, except if the
    // PretransformVertices step is used (it transforms the meshes into worldspace,
    // thus changing the mapping axis)
    if (axis * base_axis_x >= angle_epsilon)    {
        FindMeshCenter(mesh, center, min, max);
        const ai_real diff = max.x - min.x;

        // If the main axis is 'z', the z coordinate of a point 'p' is mapped
        // directly to the texture V axis. The other axis is derived from
        // the angle between ( p.x - c.x, p.y - c.y ) and (1,0), where
        // 'c' is the center point of the mesh.
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.x - min.x) / diff;
            uv.x = (std::atan2( pos.z - center.z, pos.y - center.y) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }
    else if (axis * base_axis_y >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        const ai_real diff = max.y - min.y;

        // just the same ...
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.y - min.y) / diff;
            uv.x = (std::atan2( pos.x - center.x, pos.z - center.z) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }
    else if (axis * base_axis_z >= angle_epsilon)   {
        FindMeshCenter(mesh, center, min, max);
        const ai_real diff = max.z - min.z;

        // just the same ...
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt)  {
            const aiVector3D& pos = mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.z - min.z) / diff;
            uv.x = (std::atan2( pos.y - center.y, pos.x - center.x) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }
    // slower code path in case the mapping axis is not one of the coordinate system axes
    else {
        aiMatrix4x4 mTrafo;
        aiMatrix4x4::FromToMatrix(axis,base_axis_y,mTrafo);
        FindMeshCenterTransformed(mesh, center, min, max,mTrafo);
        const ai_real diff = max.y - min.y;

        // again the same, except we're applying a transformation now
        for (unsigned int pnt = 0; pnt < mesh->mNumVertices;++pnt){
            const aiVector3D pos = mTrafo* mesh->mVertices[pnt];
            aiVector3D& uv  = out[pnt];

            uv.y = (pos.y - min.y) / diff;
            uv.x = (std::atan2( pos.x - center.x, pos.z - center.z) +(ai_real)AI_MATH_PI ) / (ai_real)AI_MATH_TWO_PI;
        }
    }

    // Now find and remove UV seams. A seam occurs if a face has a tcoord
    // close to zero on the one side, and a tcoord close to one on the
    // other side.
    RemoveUVSeams(mesh,out);
}